

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

vector<AST_*,_std::allocator<AST_*>_> * __thiscall
AST::find(vector<AST_*,_std::allocator<AST_*>_> *__return_storage_ptr__,AST *this,string *varName)

{
  ASTree *pAVar1;
  pointer ppAVar2;
  pointer ppAVar3;
  vector<ASTree_*,_std::allocator<ASTree_*>_> trees1;
  AST *local_58;
  string local_50;
  
  trees1.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  trees1.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  trees1.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AST_*,_std::allocator<AST_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AST_*,_std::allocator<AST_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AST_*,_std::allocator<AST_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pAVar1 = this->ast;
  std::__cxx11::string::string((string *)&local_50,(string *)varName);
  ASTree::find(pAVar1,&local_50,&trees1);
  std::__cxx11::string::~string((string *)&local_50);
  ppAVar2 = trees1.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppAVar3 = trees1.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppAVar3 != ppAVar2; ppAVar3 = ppAVar3 + 1) {
    pAVar1 = *ppAVar3;
    local_58 = (AST *)operator_new(8);
    local_58->ast = pAVar1;
    std::vector<AST*,std::allocator<AST*>>::emplace_back<AST*>
              ((vector<AST*,std::allocator<AST*>> *)__return_storage_ptr__,&local_58);
  }
  std::_Vector_base<ASTree_*,_std::allocator<ASTree_*>_>::~_Vector_base
            (&trees1.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<AST *> AST::find(std::string varName) {
    std::vector<ASTree *> trees1;
    std::vector<AST *> trees2;
    ast->find(varName, trees1);
    for (auto tree: trees1) {
        trees2.emplace_back(new AST(tree));
    }
    return trees2;
}